

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O1

void leveldb::BM_LogAndApply(int iters,int num_base_files)

{
  string *__return_storage_ptr__;
  AssertHelper *pAVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Comparator *pCVar3;
  int iVar4;
  long *plVar5;
  Writer *pWVar6;
  undefined4 extraout_var;
  size_type *psVar7;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar8;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar9;
  uint uVar10;
  undefined4 in_register_00000034;
  FileMetaData *message;
  char *pcVar11;
  char *in_R9;
  pointer file;
  pair<std::_Rb_tree_iterator<std::pair<int,_unsigned_long>_>,_bool> pVar12;
  bool save_manifest;
  InternalKey start;
  InternalKey limit;
  InternalKey limit_1;
  DB *db;
  string dbname;
  Status s;
  char buf [16];
  InternalKeyComparator cmp;
  VersionEdit vbase;
  Mutex mu;
  Options options;
  VersionSet vset;
  Options opts;
  undefined1 local_5b8 [24];
  undefined1 local_5a0 [8];
  string local_598;
  Comparator *local_578;
  pointer local_570;
  string local_568;
  DB *local_548;
  Writer *local_540;
  VersionSet *local_538;
  string local_530;
  pointer local_510;
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [56];
  pointer local_4b0;
  pointer ppStack_4a8;
  pointer local_4a0;
  _Rb_tree<std::pair<int,unsigned_long>,std::pair<int,unsigned_long>,std::_Identity<std::pair<int,unsigned_long>>,std::less<std::pair<int,unsigned_long>>,std::allocator<std::pair<int,unsigned_long>>>
  local_498 [8];
  undefined1 local_490 [80];
  pointer ppFStack_440;
  FileMetaData *local_438 [2];
  InternalKeyComparator local_428;
  undefined1 local_418 [8];
  undefined1 local_410 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_400 [3];
  _Alloc_hider local_3c8;
  FileMetaData *pFStack_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  undefined1 local_3a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  undefined1 local_368 [32];
  undefined1 local_348 [8];
  Options local_340;
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [576];
  Options local_90;
  
  local_538 = (VersionSet *)CONCAT44(in_register_00000034,num_base_files);
  testing::TempDir_abi_cxx11_();
  plVar5 = (long *)std::__cxx11::string::append(local_2e0);
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_530.field_2._M_allocated_capacity = *psVar7;
    local_530.field_2._8_8_ = plVar5[3];
  }
  else {
    local_530.field_2._M_allocated_capacity = *psVar7;
    local_530._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_530._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((undefined1 *)CONCAT71(local_2e0._1_7_,local_2e0[0]) != local_2d0) {
    operator_delete((undefined1 *)CONCAT71(local_2e0._1_7_,local_2e0[0]));
  }
  Options::Options((Options *)local_2e0);
  DestroyDB((leveldb *)local_418,&local_530,(Options *)local_2e0);
  if (local_418 != (undefined1  [8])0x0) {
    operator_delete__((void *)local_418);
  }
  local_548 = (DB *)0x0;
  Options::Options(&local_90);
  local_90.create_if_missing = true;
  DB::Open((DB *)(local_508 + 8),&local_90,&local_530,&local_548);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_2e0,local_410,
             (Status *)0x185e5a);
  if ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)local_2e0[0] ==
      (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
    testing::Message::Message((Message *)local_410);
    if ((pointer)local_2e0._8_8_ == (pointer)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)local_2e0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_4f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,0x8c9,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_4f8,(Message *)local_410);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4f8);
    if ((pointer)local_410._0_8_ != (pointer)0x0) {
      (*(code *)(*(FileMetaData **)local_410._0_8_)->number)();
    }
  }
  else {
    if ((pointer)local_2e0._8_8_ != (pointer)0x0) {
      if (*(pointer *)local_2e0._8_8_ != (pointer)(local_2e0._8_8_ + 0x10)) {
        operator_delete(*(pointer *)local_2e0._8_8_);
      }
      operator_delete((void *)local_2e0._8_8_);
    }
    local_410[0] = local_548 != (DB *)0x0;
    local_410._8_8_ = (pointer)0x0;
    if (local_548 != (DB *)0x0) {
      if (local_548 != (DB *)0x0) {
        (*local_548->_vptr_DB[1])();
      }
      local_548 = (DB *)0x0;
      pWVar6 = (Writer *)Env::Default();
      local_348 = (undefined1  [8])0x0;
      local_368._16_8_ = 0;
      local_368._24_8_ = (__pthread_internal_list *)0x0;
      local_368._0_8_ = 0;
      local_368._8_8_ = 0;
      iVar4 = pthread_mutex_lock((pthread_mutex_t *)local_368);
      if (iVar4 != 0) {
        std::__throw_system_error(iVar4);
      }
      local_428.user_comparator_ = BytewiseComparator();
      local_428.super_Comparator._vptr_Comparator = (_func_int **)&PTR__Comparator_001a7728;
      Options::Options((Options *)(local_348 + 8));
      VersionSet::VersionSet
                ((VersionSet *)local_2e0,&local_530,(Options *)(local_348 + 8),(TableCache *)0x0,
                 &local_428);
      VersionSet::Recover((VersionSet *)local_4f8,(bool *)local_2e0);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_410,local_5b8,
                 (Status *)"vset.Recover(&save_manifest)");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete__((void *)local_4f8._0_8_);
      }
      uVar9 = local_410._8_8_;
      if ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)local_410[0] ==
          (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
        testing::Message::Message((Message *)local_4f8);
        if ((pointer)local_410._8_8_ == (pointer)0x0) {
          message = (FileMetaData *)0x185725;
        }
        else {
          message = *(FileMetaData **)local_410._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_5b8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                   ,0x8d8,(char *)message);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_5b8,(Message *)local_4f8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_5b8);
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_4f8._0_8_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(size_type *)local_4f8._0_8_ + 8))();
        }
        uVar9 = local_410._8_8_;
        if ((pointer)local_410._8_8_ != (pointer)0x0) {
          if (*(FileMetaData **)local_410._8_8_ != (FileMetaData *)(local_410._8_8_ + 0x10)) {
            operator_delete(*(FileMetaData **)local_410._8_8_);
          }
          operator_delete((void *)uVar9);
        }
      }
      else {
        if ((pointer)local_410._8_8_ != (pointer)0x0) {
          if (*(FileMetaData **)local_410._8_8_ != (FileMetaData *)(local_410._8_8_ + 0x10)) {
            operator_delete(*(FileMetaData **)local_410._8_8_);
          }
          operator_delete((void *)uVar9);
        }
        local_410._0_8_ = local_410 + 0x10;
        local_410._8_8_ = (pointer)0x0;
        local_400[0]._M_local_buf[0] = '\0';
        local_3c8._M_p = (pointer)0x0;
        pFStack_3c0 = (FileMetaData *)0x0;
        local_3b8._M_allocated_capacity = 0;
        local_3a8._16_8_ = local_3a8;
        local_3a8._0_4_ = _S_red;
        local_3a8._8_8_ = (Version *)0x0;
        local_388._M_allocated_capacity = 0;
        local_388._8_8_ = (pointer)0x0;
        local_378._M_allocated_capacity = 0;
        local_378._8_8_ = 0;
        local_578 = (Comparator *)(ulong)(uint)iters;
        local_540 = pWVar6;
        local_3a8._24_8_ = local_3a8._16_8_;
        VersionEdit::Clear((VersionEdit *)local_410);
        if ((int)local_538 < 1) {
          file = (pointer)0x1;
        }
        else {
          paVar2 = &local_598.field_2;
          local_570 = (pointer)(ulong)((int)local_538 + 1);
          file = (pointer)0x1;
          uVar10 = 2;
          __return_storage_ptr__ = (string *)(local_5a0 + 8);
          uVar9 = extraout_RDX;
          do {
            MakeKey_abi_cxx11_(__return_storage_ptr__,(leveldb *)(ulong)uVar10,(uint)uVar9);
            local_5b8._0_8_ = local_5b8 + 0x10;
            local_5b8._8_8_ = (pointer)0x0;
            local_5b8._16_8_ = local_5b8._16_8_ & 0xffffffffffffff00;
            local_4f8._0_8_ = local_598._M_dataplus._M_p;
            local_4f8._8_8_ = local_598._M_string_length;
            local_4e8._0_8_ = (pointer)0x1;
            local_4e8._8_4_ = 1;
            AppendInternalKey((string *)local_5b8,(ParsedInternalKey *)local_4f8);
            uVar8 = extraout_EDX;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_598._M_dataplus._M_p != paVar2) {
              operator_delete(local_598._M_dataplus._M_p);
              uVar8 = extraout_EDX_00;
            }
            MakeKey_abi_cxx11_(&local_568,(leveldb *)(ulong)(uVar10 + 1),uVar8);
            local_598._M_string_length = 0;
            local_598.field_2._M_local_buf[0] = '\0';
            local_4f8._0_8_ = local_568._M_dataplus._M_p;
            local_4f8._8_8_ = local_568._M_string_length;
            local_4e8._0_8_ = (pointer)0x1;
            local_4e8._8_4_ = 0;
            local_598._M_dataplus._M_p = (pointer)paVar2;
            AppendInternalKey(__return_storage_ptr__,(ParsedInternalKey *)local_4f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_568._M_dataplus._M_p != &local_568.field_2) {
              operator_delete(local_568._M_dataplus._M_p);
            }
            VersionEdit::AddFile
                      ((VersionEdit *)local_410,2,(uint64_t)file,1,(InternalKey *)local_5b8,
                       (InternalKey *)__return_storage_ptr__);
            uVar9 = extraout_RDX_00;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_598._M_dataplus._M_p != paVar2) {
              operator_delete(local_598._M_dataplus._M_p);
              uVar9 = extraout_RDX_01;
            }
            if ((undefined1 *)local_5b8._0_8_ != local_5b8 + 0x10) {
              operator_delete((void *)local_5b8._0_8_);
              uVar9 = extraout_RDX_02;
            }
            file = file + 1;
            uVar10 = uVar10 + 2;
          } while (local_570 != file);
        }
        VersionSet::LogAndApply((VersionSet *)local_5b8,(VersionEdit *)local_2e0,(Mutex *)local_410)
        ;
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_4f8,
                   local_5a0 + 8,(Status *)"vset.LogAndApply(&vbase, &mu)");
        if ((FileMetaData **)local_5b8._0_8_ != (FileMetaData **)0x0) {
          operator_delete__((void *)local_5b8._0_8_);
        }
        pCVar3 = local_578;
        if (local_4f8[0] == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
          testing::Message::Message((Message *)local_5b8);
          if ((pointer)local_4f8._8_8_ == (pointer)0x0) {
            pcVar11 = "";
          }
          else {
            pcVar11 = *(char **)local_4f8._8_8_;
          }
          pAVar1 = (AssertHelper *)(local_5a0 + 8);
          testing::internal::AssertHelper::AssertHelper
                    (pAVar1,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                     ,0x8e0,pcVar11);
          testing::internal::AssertHelper::operator=(pAVar1,(Message *)local_5b8);
          testing::internal::AssertHelper::~AssertHelper(pAVar1);
          if ((FileMetaData **)local_5b8._0_8_ != (FileMetaData **)0x0) {
            (*(code *)(*(FileMetaData **)local_5b8._0_8_)->number)();
          }
          uVar9 = local_4f8._8_8_;
          if ((pointer)local_4f8._8_8_ != (pointer)0x0) {
            if (*(pointer *)local_4f8._8_8_ != (pointer)(local_4f8._8_8_ + 0x10)) {
              operator_delete(*(pointer *)local_4f8._8_8_);
            }
            operator_delete((void *)uVar9);
          }
        }
        else {
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
          iVar4 = (*(code *)local_540->dest_[0x15]._vptr_WritableFile)();
          local_510 = (pointer)CONCAT44(extraout_var,iVar4);
          if (0 < (int)pCVar3) {
            local_570 = (pointer)(ulong)(uint)((int)local_578 + (int)file);
            uVar10 = (int)file * 2;
            do {
              local_4f8._8_8_ = (pointer)0x0;
              local_4e8._0_8_ = local_4e8._0_8_ & 0xffffffffffffff00;
              local_4a0 = (pointer)0x0;
              local_4b0 = (pointer)0x0;
              ppStack_4a8 = (pointer)0x0;
              local_490._0_4_ = _S_red;
              local_490._8_8_ = (_Base_ptr)0x0;
              local_490._16_8_ = local_490;
              local_490._48_8_ = (pointer)0x0;
              local_490._56_8_ = (pointer)0x0;
              local_490._32_8_ = (Version *)0x0;
              local_490._40_8_ = (Version *)0x0;
              local_4f8._0_8_ = local_4e8;
              local_490._24_8_ = local_490._16_8_;
              VersionEdit::Clear((VersionEdit *)local_4f8);
              local_5b8._0_4_ = 2;
              local_5b8._8_8_ = file;
              pVar12 = std::
                       _Rb_tree<std::pair<int,unsigned_long>,std::pair<int,unsigned_long>,std::_Identity<std::pair<int,unsigned_long>>,std::less<std::pair<int,unsigned_long>>,std::allocator<std::pair<int,unsigned_long>>>
                       ::_M_insert_unique<std::pair<int,unsigned_long>>
                                 (local_498,(pair<int,_unsigned_long> *)local_5b8);
              MakeKey_abi_cxx11_(&local_568,(leveldb *)(ulong)uVar10,pVar12._8_4_);
              local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
              local_598._M_string_length = 0;
              local_598.field_2._M_local_buf[0] = '\0';
              local_5b8._0_8_ = local_568._M_dataplus._M_p;
              local_5b8._8_8_ = local_568._M_string_length;
              local_5b8._16_8_ = 1;
              local_5a0._0_4_ = 1;
              AppendInternalKey((string *)(local_5a0 + 8),(ParsedInternalKey *)local_5b8);
              uVar8 = extraout_EDX_01;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_568._M_dataplus._M_p != &local_568.field_2) {
                operator_delete(local_568._M_dataplus._M_p);
                uVar8 = extraout_EDX_02;
              }
              MakeKey_abi_cxx11_((string *)(local_490 + 0x48),(leveldb *)(ulong)(uVar10 + 1),uVar8);
              local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
              local_568._M_string_length = 0;
              local_568.field_2._M_local_buf[0] = '\0';
              local_5b8._0_8_ = local_490._72_8_;
              local_5b8._8_8_ = ppFStack_440;
              local_5b8._16_8_ = 1;
              local_5a0._0_4_ = 0;
              AppendInternalKey(&local_568,(ParsedInternalKey *)local_5b8);
              if ((FileMetaData **)local_490._72_8_ != local_438) {
                operator_delete((void *)local_490._72_8_);
              }
              VersionEdit::AddFile
                        ((VersionEdit *)local_4f8,2,(uint64_t)file,1,(InternalKey *)(local_5a0 + 8),
                         (InternalKey *)&local_568);
              VersionSet::LogAndApply
                        ((VersionSet *)local_508,(VersionEdit *)local_2e0,(Mutex *)local_4f8);
              if ((Env *)local_508._0_8_ != (Env *)0x0) {
                operator_delete__((void *)local_508._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_568._M_dataplus._M_p != &local_568.field_2) {
                operator_delete(local_568._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_598._M_dataplus._M_p != &local_598.field_2) {
                operator_delete(local_598._M_dataplus._M_p);
              }
              file = file + 1;
              VersionEdit::~VersionEdit((VersionEdit *)local_4f8);
              uVar10 = uVar10 + 2;
            } while (local_570 != file);
          }
          iVar4 = (*(code *)local_540->dest_[0x15]._vptr_WritableFile)();
          uVar10 = iVar4 - (int)local_510;
          snprintf(local_4f8,0x10,"%d",local_538);
          fprintf(_stderr,"BM_LogAndApply/%-6s   %8d iters : %9u us (%7.0f us / iter)\n",
                  SUB84((double)((float)uVar10 / (float)(int)local_578),0),local_4f8,local_578,
                  (ulong)uVar10);
        }
        VersionEdit::~VersionEdit((VersionEdit *)local_410);
      }
      VersionSet::~VersionSet((VersionSet *)local_2e0);
      Comparator::~Comparator(&local_428.super_Comparator);
      pthread_mutex_unlock((pthread_mutex_t *)local_368);
      goto LAB_0012fa24;
    }
    testing::Message::Message((Message *)local_4f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2e0,(internal *)local_410,(AssertionResult *)"db != nullptr","false",
               "true",in_R9);
    pAVar1 = (AssertHelper *)(local_348 + 8);
    testing::internal::AssertHelper::AssertHelper
              (pAVar1,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,0x8ca,(char *)CONCAT71(local_2e0._1_7_,local_2e0[0]));
    testing::internal::AssertHelper::operator=(pAVar1,(Message *)local_4f8);
    testing::internal::AssertHelper::~AssertHelper(pAVar1);
    if ((undefined1 *)CONCAT71(local_2e0._1_7_,local_2e0[0]) != local_2d0) {
      operator_delete((undefined1 *)CONCAT71(local_2e0._1_7_,local_2e0[0]));
    }
    local_2e0._8_8_ = local_410._8_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_4f8._0_8_ + 8))();
      local_2e0._8_8_ = local_410._8_8_;
    }
  }
  if ((pointer)local_2e0._8_8_ != (pointer)0x0) {
    if (*(FileMetaData **)local_2e0._8_8_ != (FileMetaData *)(local_2e0._8_8_ + 0x10)) {
      operator_delete(*(FileMetaData **)local_2e0._8_8_);
    }
    operator_delete((void *)local_2e0._8_8_);
  }
LAB_0012fa24:
  if ((pointer)local_508._8_8_ != (pointer)0x0) {
    operator_delete__((void *)local_508._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p);
  }
  return;
}

Assistant:

void BM_LogAndApply(int iters, int num_base_files) {
  std::string dbname = testing::TempDir() + "leveldb_test_benchmark";
  DestroyDB(dbname, Options());

  DB* db = nullptr;
  Options opts;
  opts.create_if_missing = true;
  Status s = DB::Open(opts, dbname, &db);
  ASSERT_LEVELDB_OK(s);
  ASSERT_TRUE(db != nullptr);

  delete db;
  db = nullptr;

  Env* env = Env::Default();

  port::Mutex mu;
  MutexLock l(&mu);

  InternalKeyComparator cmp(BytewiseComparator());
  Options options;
  VersionSet vset(dbname, &options, nullptr, &cmp);
  bool save_manifest;
  ASSERT_LEVELDB_OK(vset.Recover(&save_manifest));
  VersionEdit vbase;
  uint64_t fnum = 1;
  for (int i = 0; i < num_base_files; i++) {
    InternalKey start(MakeKey(2 * fnum), 1, kTypeValue);
    InternalKey limit(MakeKey(2 * fnum + 1), 1, kTypeDeletion);
    vbase.AddFile(2, fnum++, 1 /* file size */, start, limit);
  }
  ASSERT_LEVELDB_OK(vset.LogAndApply(&vbase, &mu));

  uint64_t start_micros = env->NowMicros();

  for (int i = 0; i < iters; i++) {
    VersionEdit vedit;
    vedit.RemoveFile(2, fnum);
    InternalKey start(MakeKey(2 * fnum), 1, kTypeValue);
    InternalKey limit(MakeKey(2 * fnum + 1), 1, kTypeDeletion);
    vedit.AddFile(2, fnum++, 1 /* file size */, start, limit);
    vset.LogAndApply(&vedit, &mu);
  }
  uint64_t stop_micros = env->NowMicros();
  unsigned int us = stop_micros - start_micros;
  char buf[16];
  std::snprintf(buf, sizeof(buf), "%d", num_base_files);
  std::fprintf(stderr,
               "BM_LogAndApply/%-6s   %8d iters : %9u us (%7.0f us / iter)\n",
               buf, iters, us, ((float)us) / iters);
}